

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O3

bool flecs::_::pack_args_to_string<Position,Rocket>(world_t *world,stringstream *str,bool is_each)

{
  char *__s;
  char *__s_00;
  undefined8 *puVar1;
  size_t sVar2;
  long lVar3;
  ostream *poVar4;
  array<const_char_*,_2UL> ids;
  char *local_40 [2];
  
  local_40[0] = component_info<Position>::name(world);
  local_40[1] = component_info<Rocket>::name(world);
  poVar4 = (ostream *)(str + 0x10);
  lVar3 = 0;
  do {
    __s = *(char **)((long)local_40 + lVar3);
    if (lVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"",0);
      puVar1 = &DAT_00153d88;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"",0);
      puVar1 = (undefined8 *)((long)&DAT_00153d88 + lVar3);
    }
    __s_00 = (char *)*puVar1;
    if (__s_00 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar2 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s_00,sVar2);
    }
    if (is_each) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ANY:",4);
    }
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar2);
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x10);
  return true;
}

Assistant:

bool pack_args_to_string(world_t *world, std::stringstream& str, bool is_each) {
    (void)world;

    std::array<const char*, sizeof...(Components)> ids = {
        (_::component_info<Components>::name(world))...
    };

    std::array<const char*, sizeof...(Components)> inout_modifiers = {
        (inout_modifier<Components>())...
    }; 

    std::array<const char*, sizeof...(Components)> optional_modifiers = {
        (optional_modifier<Components>())...
    };        

    size_t i = 0;
    for (auto id : ids) {
        if (i) {
            str << ",";
        }
        
        str << inout_modifiers[i];
        str << optional_modifiers[i];

        if (is_each) {
            str << "ANY:";
        }
        str << id;
        i ++;
    }  

    return i != 0;
}